

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::TextBasedObject::TextBasedObject(TextBasedObject *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UL *pUVar3;
  MDDEntry *pMVar4;
  
  DescriptiveObject::DescriptiveObject(&this->super_DescriptiveObject,d);
  (this->super_DescriptiveObject).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__TextBasedObject_00224ce8;
  (this->PayloadSchemeID).super_Identifier<16U>.m_HasValue = false;
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[0] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[1] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[2] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[3] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[4] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[5] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &this->PayloadSchemeID;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->PayloadSchemeID).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  (this->TextMIMEMediaType).super_string._M_dataplus._M_p =
       (pointer)&(this->TextMIMEMediaType).super_string.field_2;
  (this->TextMIMEMediaType).super_string._M_string_length = 0;
  (this->TextMIMEMediaType).super_string.field_2._M_local_buf[0] = '\0';
  (this->TextMIMEMediaType).super_IArchive._vptr_IArchive = (_func_int **)&PTR__UTF16String_00221c70
  ;
  (this->RFC5646TextLanguageCode).super_string._M_dataplus._M_p =
       (pointer)&(this->RFC5646TextLanguageCode).super_string.field_2;
  (this->RFC5646TextLanguageCode).super_string._M_string_length = 0;
  (this->RFC5646TextLanguageCode).super_string.field_2._M_local_buf[0] = '\0';
  (this->RFC5646TextLanguageCode).super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__UTF16String_00221c70;
  (this->TextDataDescription).m_property.super_string._M_dataplus._M_p =
       (pointer)&(this->TextDataDescription).m_property.super_string.field_2;
  (this->TextDataDescription).m_property.super_string._M_string_length = 0;
  (this->TextDataDescription).m_property.super_string.field_2._M_local_buf[0] = '\0';
  (this->TextDataDescription).m_property.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__UTF16String_00221c70;
  (this->TextDataDescription).m_has_value = false;
  this_00 = (this->super_DescriptiveObject).super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_TextBasedObject);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_DescriptiveObject).super_InterchangeObject.super_KLVPacket.m_UL.
    super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_DescriptiveObject).super_InterchangeObject.super_KLVPacket.m_UL.
     super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_DescriptiveObject).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 8) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x12a0,"ASDCP::MXF::TextBasedObject::TextBasedObject(const Dictionary *)");
}

Assistant:

TextBasedObject::TextBasedObject(const Dictionary* d) : DescriptiveObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_TextBasedObject);
}